

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O1

uint8_t * svb_decode_avx_d1_init
                    (uint32_t *out,uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  byte bVar5;
  uint8_t *puVar4;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  if (0x1f < count) {
    auVar11 = vpbroadcastd_avx512vl();
    uVar6 = *(ulong *)keyPtr;
    if (count >> 5 != 1) {
      uVar7 = 1;
      uVar9 = uVar6;
      do {
        uVar6 = *(ulong *)(keyPtr + uVar7 * 8);
        auVar11 = vpshufd_avx(auVar11,0xff);
        if (uVar9 == 0) {
          auVar13 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
          auVar13 = vpmovzxbw_avx(auVar13);
          auVar14 = vpslldq_avx(auVar13,2);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar14 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar13,auVar14);
          auVar14 = vpmovzxwd_avx(auVar13);
          auVar11 = vpaddd_avx(auVar11,auVar14);
          auVar13 = vpunpckhwd_avx(auVar13,(undefined1  [16])0x0);
          auVar13 = vpaddd_avx(auVar11,auVar13);
          *(undefined1 (*) [16])out = auVar11;
          *(undefined1 (*) [16])((long)out + 0x10) = auVar13;
          auVar11 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
          auVar11 = vpmovzxbw_avx(auVar11);
          auVar12 = vpslldq_avx(auVar11,2);
          auVar14 = vpshufd_avx(auVar13,0xff);
          auVar11 = vpaddd_avx(auVar12,auVar11);
          auVar13 = vpslldq_avx(auVar11,4);
          auVar11 = vpaddd_avx(auVar11,auVar13);
          auVar13 = vpmovzxwd_avx(auVar11);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar11 = vpunpckhwd_avx(auVar11,(undefined1  [16])0x0);
          auVar14 = vpaddd_avx(auVar13,auVar11);
          *(undefined1 (*) [16])((long)out + 0x20) = auVar13;
          *(undefined1 (*) [16])((long)out + 0x30) = auVar14;
          auVar11 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
          auVar11 = vpmovzxbw_avx(auVar11);
          auVar13 = vpslldq_avx(auVar11,2);
          auVar14 = vpshufd_avx(auVar14,0xff);
          auVar11 = vpaddd_avx(auVar13,auVar11);
          auVar13 = vpslldq_avx(auVar11,4);
          auVar11 = vpaddd_avx(auVar11,auVar13);
          auVar13 = vpmovzxwd_avx(auVar11);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar11 = vpunpckhwd_avx(auVar11,(undefined1  [16])0x0);
          auVar14 = vpaddd_avx(auVar13,auVar11);
          *(undefined1 (*) [16])((long)out + 0x40) = auVar13;
          *(undefined1 (*) [16])((long)out + 0x50) = auVar14;
          auVar11 = vlddqu_avx(*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8));
          auVar11 = vpmovzxbw_avx(auVar11);
          auVar13 = vpslldq_avx(auVar11,2);
          auVar14 = vpshufd_avx(auVar14,0xff);
          auVar11 = vpaddd_avx(auVar13,auVar11);
          auVar13 = vpslldq_avx(auVar11,4);
          auVar11 = vpaddd_avx(auVar11,auVar13);
          auVar13 = vpmovzxwd_avx(auVar11);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar11 = vpunpckhwd_avx(auVar11,(undefined1  [16])0x0);
          auVar11 = vpaddd_avx(auVar13,auVar11);
          *(undefined1 (*) [16])((long)out + 0x60) = auVar13;
          *(undefined1 (*) [16])((long)out + 0x70) = auVar11;
          dataPtr = (uint8_t *)((long)dataPtr + 0x20);
        }
        else {
          uVar10 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                          [uVar9 & 0xff];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                                *(undefined1 (*) [16])
                                 (shuffleTable[0] + (uint)((int)(uVar9 & 0xff) << 4)));
          auVar14 = vpslldq_avx(auVar13,4);
          auVar13 = vpaddd_avx(auVar14,auVar13);
          auVar11 = vpaddd_avx(auVar13,auVar11);
          auVar13 = vpslldq_avx(auVar13,8);
          auVar11 = vpaddd_avx(auVar11,auVar13);
          *(undefined1 (*) [16])out = auVar11;
          bVar5 = (byte)(uVar9 >> 8);
          bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [bVar5];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar10),
                                (undefined1  [16])shuffleTable[bVar5]);
          lVar2 = bVar1 + uVar10;
          auVar12 = vpslldq_avx(auVar13,4);
          auVar14 = vpshufd_avx(auVar11,0xff);
          auVar11 = vpaddd_avx(auVar12,auVar13);
          auVar13 = vpaddd_avx(auVar11,auVar14);
          auVar11 = vpslldq_avx(auVar11,8);
          auVar11 = vpaddd_avx(auVar13,auVar11);
          *(undefined1 (*) [16])((long)out + 0x10) = auVar11;
          uVar8 = (uint)uVar9 >> 0x10 & 0xff;
          bVar5 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [uVar8];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + bVar1 + uVar10),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uVar8 << 4)));
          lVar3 = (ulong)bVar5 + lVar2;
          auVar12 = vpslldq_avx(auVar13,4);
          auVar14 = vpshufd_avx(auVar11,0xff);
          auVar11 = vpaddd_avx(auVar12,auVar13);
          auVar13 = vpslldq_avx(auVar11,8);
          auVar11 = vpaddd_avx(auVar11,auVar13);
          auVar11 = vpaddd_avx(auVar11,auVar14);
          *(undefined1 (*) [16])((long)out + 0x20) = auVar11;
          uVar10 = uVar9 >> 0x18 & 0xff;
          bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [uVar10];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + (ulong)bVar5 + lVar2),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
          lVar2 = (ulong)bVar1 + lVar3;
          auVar12 = vpslldq_avx(auVar13,4);
          auVar14 = vpshufd_avx(auVar11,0xff);
          auVar11 = vpaddd_avx(auVar12,auVar13);
          auVar13 = vpslldq_avx(auVar11,8);
          auVar11 = vpaddd_avx(auVar11,auVar13);
          auVar11 = vpaddd_avx(auVar11,auVar14);
          *(undefined1 (*) [16])((long)out + 0x30) = auVar11;
          uVar10 = uVar9 >> 0x20 & 0xff;
          bVar5 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [uVar10];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar3),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
          lVar3 = (ulong)bVar5 + lVar2;
          auVar12 = vpslldq_avx(auVar13,4);
          auVar14 = vpshufd_avx(auVar11,0xff);
          auVar11 = vpaddd_avx(auVar12,auVar13);
          auVar13 = vpslldq_avx(auVar11,8);
          auVar11 = vpaddd_avx(auVar11,auVar13);
          auVar11 = vpaddd_avx(auVar11,auVar14);
          *(undefined1 (*) [16])((long)out + 0x40) = auVar11;
          uVar10 = uVar9 >> 0x28 & 0xff;
          bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [uVar10];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + (ulong)bVar5 + lVar2),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
          lVar2 = (ulong)bVar1 + lVar3;
          auVar12 = vpslldq_avx(auVar13,4);
          auVar14 = vpshufd_avx(auVar11,0xff);
          auVar11 = vpaddd_avx(auVar12,auVar13);
          auVar13 = vpslldq_avx(auVar11,8);
          auVar11 = vpaddd_avx(auVar11,auVar13);
          auVar11 = vpaddd_avx(auVar11,auVar14);
          *(undefined1 (*) [16])((long)out + 0x50) = auVar11;
          uVar10 = uVar9 >> 0x30 & 0xff;
          bVar5 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                  [uVar10];
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar3),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
          auVar12 = vpslldq_avx(auVar13,4);
          auVar14 = vpshufd_avx(auVar11,0xff);
          auVar11 = vpaddd_avx(auVar12,auVar13);
          auVar13 = vpslldq_avx(auVar11,8);
          auVar11 = vpaddd_avx(auVar11,auVar13);
          auVar11 = vpaddd_avx(auVar11,auVar14);
          *(undefined1 (*) [16])((long)out + 0x60) = auVar11;
          auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr + (ulong)bVar5 + lVar2),
                                (undefined1  [16])shuffleTable[uVar9 >> 0x38]);
          dataPtr = *(undefined1 (*) [16])dataPtr +
                    (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar9 >> 0x38] + (ulong)bVar5 + lVar2;
          auVar12 = vpslldq_avx(auVar13,4);
          auVar14 = vpshufd_avx(auVar11,0xff);
          auVar11 = vpaddd_avx(auVar12,auVar13);
          auVar13 = vpslldq_avx(auVar11,8);
          auVar11 = vpaddd_avx(auVar11,auVar13);
          auVar11 = vpaddd_avx(auVar11,auVar14);
          *(undefined1 (*) [16])((long)out + 0x70) = auVar11;
        }
        out = (uint32_t *)((long)out + 0x80);
        uVar7 = uVar7 + 1;
        uVar9 = uVar6;
      } while (count >> 5 != uVar7);
    }
    if (uVar6 == 0) {
      auVar13 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
      auVar13 = vpmovzxbw_avx(auVar13);
      auVar12 = vpslldq_avx(auVar13,2);
      auVar14 = vpshufd_avx(auVar11,0xff);
      auVar11 = vpaddd_avx(auVar12,auVar13);
      auVar13 = vpslldq_avx(auVar11,4);
      auVar11 = vpaddd_avx(auVar11,auVar13);
      auVar13 = vpmovzxwd_avx(auVar11);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar11 = vpunpckhwd_avx(auVar11,(undefined1  [16])0x0);
      auVar14 = vpaddd_avx(auVar13,auVar11);
      *(undefined1 (*) [16])out = auVar13;
      *(undefined1 (*) [16])((long)out + 0x10) = auVar14;
      auVar11 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
      auVar11 = vpmovzxbw_avx(auVar11);
      auVar13 = vpslldq_avx(auVar11,2);
      auVar14 = vpshufd_avx(auVar14,0xff);
      auVar11 = vpaddd_avx(auVar13,auVar11);
      auVar13 = vpslldq_avx(auVar11,4);
      auVar11 = vpaddd_avx(auVar11,auVar13);
      auVar13 = vpmovzxwd_avx(auVar11);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar11 = vpunpckhwd_avx(auVar11,(undefined1  [16])0x0);
      auVar14 = vpaddd_avx(auVar13,auVar11);
      *(undefined1 (*) [16])((long)out + 0x20) = auVar13;
      *(undefined1 (*) [16])((long)out + 0x30) = auVar14;
      auVar11 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
      auVar11 = vpmovzxbw_avx(auVar11);
      auVar13 = vpslldq_avx(auVar11,2);
      auVar14 = vpshufd_avx(auVar14,0xff);
      auVar11 = vpaddd_avx(auVar13,auVar11);
      auVar13 = vpslldq_avx(auVar11,4);
      auVar11 = vpaddd_avx(auVar11,auVar13);
      auVar13 = vpmovzxwd_avx(auVar11);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar11 = vpunpckhwd_avx(auVar11,(undefined1  [16])0x0);
      auVar14 = vpaddd_avx(auVar13,auVar11);
      *(undefined1 (*) [16])((long)out + 0x40) = auVar13;
      *(undefined1 (*) [16])((long)out + 0x50) = auVar14;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)(*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8);
      auVar11 = vpmovzxbw_avx(auVar11);
      auVar13 = vpslldq_avx(auVar11,2);
      auVar14 = vpshufd_avx(auVar14,0xff);
      auVar11 = vpaddd_avx(auVar13,auVar11);
      auVar13 = vpslldq_avx(auVar11,4);
      auVar11 = vpaddd_avx(auVar11,auVar13);
      auVar13 = vpmovzxwd_avx(auVar11);
      auVar13 = vpaddd_avx(auVar14,auVar13);
      auVar11 = vpunpckhwd_avx(auVar11,(undefined1  [16])0x0);
      auVar11 = vpaddd_avx(auVar13,auVar11);
      *(undefined1 (*) [16])((long)out + 0x60) = auVar13;
      *(undefined1 (*) [16])((long)out + 0x70) = auVar11;
      dataPtr = (uint8_t *)((long)dataPtr + 0x20);
    }
    else {
      uVar9 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar6 & 0xff];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                            *(undefined1 (*) [16])
                             (shuffleTable[0] + (uint)((int)(uVar6 & 0xff) << 4)));
      auVar12 = vpslldq_avx(auVar13,4);
      auVar14 = vpshufd_avx(auVar11,0xff);
      auVar11 = vpaddd_avx(auVar12,auVar13);
      auVar13 = vpaddd_avx(auVar11,auVar14);
      auVar11 = vpslldq_avx(auVar11,8);
      auVar11 = vpaddd_avx(auVar13,auVar11);
      *(undefined1 (*) [16])out = auVar11;
      bVar5 = (byte)(uVar6 >> 8);
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [bVar5];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar9),
                            (undefined1  [16])shuffleTable[bVar5]);
      lVar2 = bVar1 + uVar9;
      auVar12 = vpslldq_avx(auVar13,4);
      auVar14 = vpshufd_avx(auVar11,0xff);
      auVar11 = vpaddd_avx(auVar12,auVar13);
      auVar13 = vpaddd_avx(auVar11,auVar14);
      auVar11 = vpslldq_avx(auVar11,8);
      auVar11 = vpaddd_avx(auVar13,auVar11);
      *(undefined1 (*) [16])((long)out + 0x10) = auVar11;
      uVar8 = (uint)uVar6 >> 0x10 & 0xff;
      bVar5 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar8];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + bVar1 + uVar9),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uVar8 << 4)));
      lVar3 = (ulong)bVar5 + lVar2;
      auVar12 = vpslldq_avx(auVar13,4);
      auVar14 = vpshufd_avx(auVar11,0xff);
      auVar11 = vpaddd_avx(auVar12,auVar13);
      auVar13 = vpslldq_avx(auVar11,8);
      auVar11 = vpaddd_avx(auVar11,auVar13);
      auVar11 = vpaddd_avx(auVar11,auVar14);
      *(undefined1 (*) [16])((long)out + 0x20) = auVar11;
      uVar9 = uVar6 >> 0x18 & 0xff;
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar9];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr + (ulong)bVar5 + lVar2),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
      lVar2 = (ulong)bVar1 + lVar3;
      auVar12 = vpslldq_avx(auVar13,4);
      auVar14 = vpshufd_avx(auVar11,0xff);
      auVar11 = vpaddd_avx(auVar12,auVar13);
      auVar13 = vpslldq_avx(auVar11,8);
      auVar11 = vpaddd_avx(auVar11,auVar13);
      auVar11 = vpaddd_avx(auVar11,auVar14);
      *(undefined1 (*) [16])((long)out + 0x30) = auVar11;
      uVar9 = uVar6 >> 0x20 & 0xff;
      bVar5 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar9];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar3),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
      lVar3 = (ulong)bVar5 + lVar2;
      auVar12 = vpslldq_avx(auVar13,4);
      auVar14 = vpshufd_avx(auVar11,0xff);
      auVar11 = vpaddd_avx(auVar12,auVar13);
      auVar13 = vpslldq_avx(auVar11,8);
      auVar11 = vpaddd_avx(auVar11,auVar13);
      auVar11 = vpaddd_avx(auVar11,auVar14);
      *(undefined1 (*) [16])((long)out + 0x40) = auVar11;
      uVar9 = uVar6 >> 0x28 & 0xff;
      bVar1 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar9];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr + (ulong)bVar5 + lVar2),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
      lVar2 = (ulong)bVar1 + lVar3;
      auVar12 = vpslldq_avx(auVar13,4);
      auVar14 = vpshufd_avx(auVar11,0xff);
      auVar11 = vpaddd_avx(auVar12,auVar13);
      auVar13 = vpslldq_avx(auVar11,8);
      auVar11 = vpaddd_avx(auVar11,auVar13);
      auVar11 = vpaddd_avx(auVar11,auVar14);
      *(undefined1 (*) [16])((long)out + 0x50) = auVar11;
      uVar9 = uVar6 >> 0x30 & 0xff;
      bVar5 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [uVar9];
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr + (ulong)bVar1 + lVar3),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
      auVar12 = vpslldq_avx(auVar13,4);
      auVar14 = vpshufd_avx(auVar11,0xff);
      auVar11 = vpaddd_avx(auVar12,auVar13);
      auVar13 = vpslldq_avx(auVar11,8);
      auVar11 = vpaddd_avx(auVar11,auVar13);
      auVar11 = vpaddd_avx(auVar11,auVar14);
      *(undefined1 (*) [16])((long)out + 0x60) = auVar11;
      auVar13 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr + (ulong)bVar5 + lVar2),
                            (undefined1  [16])shuffleTable[uVar6 >> 0x38]);
      dataPtr = *(undefined1 (*) [16])dataPtr +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar6 >> 0x38] + (ulong)bVar5 + lVar2;
      auVar12 = vpslldq_avx(auVar13,4);
      auVar14 = vpshufd_avx(auVar11,0xff);
      auVar11 = vpaddd_avx(auVar12,auVar13);
      auVar13 = vpslldq_avx(auVar11,8);
      auVar11 = vpaddd_avx(auVar11,auVar13);
      auVar11 = vpaddd_avx(auVar11,auVar14);
      *(undefined1 (*) [16])((long)out + 0x70) = auVar11;
    }
    prev = *(uint32_t *)(*(undefined1 (*) [16])((long)out + 0x70) + 0xc);
    out = (uint32_t *)((long)out + 0x80);
  }
  puVar4 = svb_decode_scalar_d1_init(out,keyPtr + (count >> 5) * 8,dataPtr,(uint)count & 0x1f,prev);
  return puVar4;
}

Assistant:

uint8_t *svb_decode_avx_d1_init(uint32_t *out, uint8_t *__restrict__ keyPtr,
                                uint8_t *__restrict__ dataPtr, uint64_t count,
                                uint32_t prev) {
  uint64_t keybytes = count / 4; // number of key bytes
  if (keybytes >= 8) {
    xmm_t Prev = _mm_set1_epi32(prev);
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        Prev = _write_16bit_avx_d1(out, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        Prev = _write_16bit_avx_d1(out + 8, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        Prev = _write_16bit_avx_d1(out + 16, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        Prev = _write_16bit_avx_d1(out + 24, Data, Prev);
        out += 32;
        dataPtr += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      Prev = _write_avx_d1(out, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 4, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 8, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 12, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 16, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 20, Data, Prev);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      Prev = _write_avx_d1(out + 24, Data, Prev);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      Prev = _write_avx_d1(out + 28, Data, Prev);

      out += 32;
    }
    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        Prev = _write_16bit_avx_d1(out, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        Prev = _write_16bit_avx_d1(out + 8, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        Prev = _write_16bit_avx_d1(out + 16, Data, Prev);
        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _write_16bit_avx_d1(out + 24, Data, Prev);
        out += 32;
        dataPtr += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        Prev = _write_avx_d1(out, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 4, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 8, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 12, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 16, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        Prev = _write_avx_d1(out + 20, Data, Prev);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        Prev = _write_avx_d1(out + 24, Data, Prev);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        _write_avx_d1(out + 28, Data, Prev);

        out += 32;
      }
    }
    prev = out[-1];
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  return svb_decode_scalar_d1_init(out, keyPtr + consumedkeys, dataPtr,
                                   count & 31, prev);
}